

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute-eval.hh
# Opt level: O2

void __thiscall
tinyusdz::tydra::TerminalAttributeValue::~TerminalAttributeValue(TerminalAttributeValue *this)

{
  vtable_type *pvVar1;
  
  AttrMetas::~AttrMetas(&this->_meta);
  pvVar1 = (this->_value).v_.vtable;
  if (pvVar1 != (vtable_type *)0x0) {
    (*pvVar1->destroy)((storage_union *)&this->_value);
    (this->_value).v_.vtable = (vtable_type *)0x0;
  }
  ::std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

TerminalAttributeValue() = default;